

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void mbc3_write_ext_ram(Emulator *e,MaskedAddress addr,u8 value)

{
  Bool BVar1;
  Ticks local_38;
  Bool old_rtc_halt;
  Mbc3 *mbc3;
  u8 value_local;
  MaskedAddress addr_local;
  Emulator *e_local;
  
  if ((e->state).memory_map_state.ext_ram_enabled != FALSE) {
    if ((e->state).memory_map_state.field_3.mbc3.rtc_reg < 4) {
      gb_write_ext_ram(e,addr,value);
    }
    else if ((e->state).memory_map_state.field_3.mbc3.latched != FALSE) {
      switch((e->state).memory_map_state.field_3.mbc3.rtc_reg) {
      case '\b':
        (e->state).memory_map_state.field_3.mbc1.byte_2000_3fff = value & 0x3f;
        if ((e->state).memory_map_state.field_3.mbc3.rtc_halt == FALSE) {
          local_38 = (e->state).ticks;
        }
        else {
          local_38 = 0;
        }
        (e->state).memory_map_state.field_3.mbc3.latch_ticks = local_38;
        break;
      case '\t':
        (e->state).memory_map_state.field_3.mbc1.byte_4000_5fff = value & 0x3f;
        break;
      case '\n':
        (e->state).memory_map_state.field_3.mbc3.hour = value & 0x1f;
        break;
      case '\v':
        (e->state).memory_map_state.field_3.mbc3.day =
             (e->state).memory_map_state.field_3.mbc3.day & 0x100 | (ushort)value;
        break;
      case '\f':
        (e->state).memory_map_state.field_3.mbc3.day =
             (value & 1) << 8 | (e->state).memory_map_state.field_3.mbc3.day & 0xff;
        (e->state).memory_map_state.field_3.mbc3.day_carry = (int)(uint)value >> 7;
        BVar1 = (e->state).memory_map_state.field_3.mbc3.rtc_halt;
        (e->state).memory_map_state.field_3.mbc3.rtc_halt = (int)(uint)value >> 6 & TRUE;
        if ((e->state).memory_map_state.field_3.mbc3.rtc_halt != BVar1) {
          (e->state).memory_map_state.field_3.mbc3.latch_ticks =
               (e->state).ticks - (e->state).memory_map_state.field_3.mbc3.latch_ticks;
        }
      }
    }
  }
  return;
}

Assistant:

static void mbc3_write_ext_ram(Emulator* e, MaskedAddress addr, u8 value) {
  if (!MMAP_STATE.ext_ram_enabled) {
    return;
  }

  Mbc3* mbc3 = &MMAP_STATE.mbc3;
  if (mbc3->rtc_reg <= 3) {
    gb_write_ext_ram(e, addr, value);
    return;
  }

  if (!mbc3->latched) {
    return;
  }

  switch (mbc3->rtc_reg) {
    case 8:
      mbc3->sec = value & 63;
      /* Reset the tick timer. Note that if the RTC timer is halted then
       * latch_ticks is a previously stored delta, not an absolute tick timer.
       * Once the timer is restarted then latch_ticks is an absolute timer
       * again. */
      mbc3->latch_ticks = mbc3->rtc_halt ? 0 : TICKS;
      break;
    case 9: mbc3->min = value & 63; break;
    case 10: mbc3->hour = value & 31; break;
    case 11: mbc3->day = (mbc3->day & 0x100) | value; break;
    case 12: {
      mbc3->day = (UNPACK(value, MBC3_RTC_DAY_HI) << 8) | (mbc3->day & 0xff);
      mbc3->day_carry = UNPACK(value, MBC3_RTC_DAY_CARRY);
      Bool old_rtc_halt = mbc3->rtc_halt;
      mbc3->rtc_halt = UNPACK(value, MBC3_RTC_HALT);
      if (mbc3->rtc_halt != old_rtc_halt) {
        // Update the tick timer; if the clock is halted, then store the
        // previous delta before the clock was stopped. If the clock is
        // restarted, then subtract that delta from the current tick timer to
        // "add" in the delta that is not yet accounted for in the RTC
        // registers.
        mbc3->latch_ticks = TICKS - mbc3->latch_ticks;
      }
      break;
    }
    default:
      break;
  }
}